

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::autoRescalePartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,short *scaleFactors)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  int expMax;
  int local_44;
  long local_40;
  short *local_38;
  
  lVar7 = 0;
  local_38 = scaleFactors;
  while (lVar7 < this->kPatternCount) {
    iVar1 = this->kPartialsPaddedStateCount;
    uVar4 = this->kCategoryCount;
    auVar10 = ZEXT864(0) << 0x40;
    iVar2 = iVar1 * (int)lVar7;
    for (uVar5 = 0; uVar5 != (~((int)uVar4 >> 0x1f) & uVar4); uVar5 = uVar5 + 1) {
      lVar6 = 0;
      while ((~(this->kStateCount >> 0x1f) & this->kStateCount) != (uint)lVar6) {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = destP[iVar2 + lVar6];
        lVar6 = lVar6 + 1;
        auVar11 = vmaxsd_avx(auVar11,auVar10._0_16_);
        auVar10 = ZEXT1664(auVar11);
      }
      iVar2 = iVar2 + this->kPaddedPatternCount * iVar1;
    }
    frexp(auVar10._0_8_,&local_44);
    local_38[lVar7] = (short)local_44;
    local_40 = lVar7;
    if (local_44 != 0) {
      iVar2 = -local_44;
      for (iVar8 = 0; iVar8 < (int)uVar4; iVar8 = iVar8 + 1) {
        iVar3 = this->kPaddedPatternCount * this->kPartialsPaddedStateCount * iVar8 +
                iVar1 * (int)lVar7;
        for (lVar6 = 0; (int)lVar6 < this->kStateCount; lVar6 = lVar6 + 1) {
          dVar9 = ldexp(1.0,iVar2);
          destP[iVar3 + lVar6] = dVar9 * destP[iVar3 + lVar6];
        }
        uVar4 = this->kCategoryCount;
      }
    }
    lVar7 = local_40 + 1;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::autoRescalePartials(REALTYPE* destP,
                                              signed short* scaleFactors) {


    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        int expMax;
        frexp(max, &expMax);
        scaleFactors[k] = expMax;

        if (expMax != 0) {
            for (int l = 0; l < kCategoryCount; l++) {
                int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
                for (int i = 0; i < kStateCount; i++)
                    destP[offset++] *= pow(2.0, -expMax);
            }
        }
    }
}